

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void * alsaMidiHandler(void *ptr)

{
  pollfd pVar1;
  byte bVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  code *pcVar7;
  undefined8 uVar8;
  size_t __nbytes;
  long lVar9;
  bool bVar10;
  pointer puVar11;
  double dVar12;
  uchar *puVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uchar *puVar18;
  ulong uVar19;
  pollfd *__fds;
  ulong uVar20;
  ulong uVar21;
  ulong uStack_80;
  pollfd local_78;
  undefined1 local_70 [8];
  MidiMessage message;
  snd_seq_event_t *ev;
  undefined1 local_39;
  uchar *puStack_38;
  bool dummy;
  
  __fds = &local_78;
  puVar5 = *(undefined8 **)((long)ptr + 0x40);
  uStack_80 = 0x10a2d9;
  MidiInApi::MidiMessage::MidiMessage((MidiMessage *)local_70);
  *(undefined4 *)(puVar5 + 4) = 0x20;
  pVar1 = (pollfd)(puVar5 + 3);
  uStack_80 = 0x10a2ee;
  iVar15 = snd_midi_event_new(0,pVar1);
  if (iVar15 < 0) {
    *(undefined1 *)((long)ptr + 0x39) = 0;
    uStack_80 = 0x10a694;
    std::operator<<((ostream *)&std::cerr,
                    "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n");
  }
  else {
    uStack_80 = 0x10a2fe;
    puStack_38 = (uchar *)malloc((ulong)*(uint *)(puVar5 + 4));
    if (puStack_38 == (uchar *)0x0) {
      *(undefined1 *)((long)ptr + 0x39) = 0;
      uStack_80 = 0x10a6a3;
      snd_midi_event_free(*(undefined8 *)pVar1);
      *(undefined8 *)pVar1 = 0;
      uStack_80 = 0x10a6ba;
      std::operator<<((ostream *)&std::cerr,
                      "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n");
      __fds = &local_78;
    }
    else {
      uStack_80 = 0x10a313;
      snd_midi_event_init(*(undefined8 *)pVar1);
      uStack_80 = 0x10a31e;
      snd_midi_event_no_status(*(undefined8 *)pVar1,1);
      uStack_80 = 0x10a329;
      iVar15 = snd_seq_poll_descriptors_count(*puVar5,1);
      uVar19 = (long)iVar15 * 8 + 0x17U & 0xfffffffffffffff0;
      lVar9 = -uVar19;
      __fds = (pollfd *)((long)&local_78 + lVar9);
      uVar6 = *puVar5;
      *(undefined8 *)((long)&uStack_80 + lVar9) = 1;
      uVar8 = *(undefined8 *)((long)&uStack_80 + lVar9);
      *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a35c;
      snd_seq_poll_descriptors(uVar6,local_70 + -uVar19,iVar15,uVar8);
      local_78 = pVar1;
      __fds->fd = *(int *)((long)puVar5 + 0x4c);
      *(undefined2 *)((long)&local_78 + lVar9 + 4) = 1;
      bVar10 = false;
      *(undefined8 *)((long)&uStack_80 + lVar9) = 1;
      uVar19 = *(ulong *)((long)&uStack_80 + lVar9);
      while (puVar13 = puStack_38, *(char *)((long)ptr + 0x39) == '\x01') {
        uVar6 = *puVar5;
        *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a393;
        iVar16 = snd_seq_event_input_pending(uVar6,uVar19 & 0xffffffff);
        if (iVar16 == 0) {
          *(undefined8 *)((long)&uStack_80 + lVar9) = 0xffffffffffffffff;
          uVar6 = *(undefined8 *)((long)&uStack_80 + lVar9);
          *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a3cb;
          iVar16 = poll(__fds,(long)iVar15 + 1,(int)uVar6);
          if ((-1 < iVar16) && ((*(byte *)((long)&local_78 + lVar9 + 6) & 1) != 0)) {
            iVar16 = __fds->fd;
            *(undefined8 *)((long)&uStack_80 + lVar9) = 1;
            __nbytes = *(size_t *)((long)&uStack_80 + lVar9);
            *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a3e6;
            read(iVar16,&local_39,__nbytes);
          }
        }
        else {
          uVar6 = *puVar5;
          *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a3a3;
          iVar16 = snd_seq_event_input(uVar6,&message.timeStamp);
          puVar13 = puStack_38;
          if (iVar16 == -0x1c) {
            *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a3bb;
            std::operator<<((ostream *)&std::cerr,
                            "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n");
          }
          else if (iVar16 < 1) {
            *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a3ff;
            std::operator<<((ostream *)&std::cerr,
                            "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n");
            *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a40b;
            perror("System reports");
          }
          else {
            if ((!bVar10) &&
               ((undefined1  [8])
                message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != local_70)) {
              message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
            }
            bVar2 = *(byte *)message.timeStamp;
            if (1 < bVar2 - 0x42) {
              if (bVar2 == 0x82) {
                if ((*(byte *)((long)ptr + 0x38) & 1) != 0) goto LAB_0010a5c9;
                if (*(uint *)(puVar5 + 4) < *(uint *)((long)message.timeStamp + 0x10)) {
                  *(uint *)(puVar5 + 4) = *(uint *)((long)message.timeStamp + 0x10);
                  *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a489;
                  free(puVar13);
                  uVar4 = *(uint *)(puVar5 + 4);
                  *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a491;
                  puStack_38 = (uchar *)malloc((ulong)uVar4);
                  if (puStack_38 == (uchar *)0x0) {
                    *(undefined1 *)((long)ptr + 0x39) = 0;
                    *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a64b;
                    std::operator<<((ostream *)&std::cerr,
                                    "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n"
                                   );
                    puStack_38 = (uchar *)0x0;
                    goto LAB_0010a5c9;
                  }
                }
              }
              else {
                if ((bVar2 == 0x24) || (bVar2 == 0x25)) {
LAB_0010a452:
                  bVar2 = *(byte *)((long)ptr + 0x38) & 2;
                }
                else {
                  if (bVar2 != 0x2a) {
                    if (bVar2 != 0x16) goto LAB_0010a4a2;
                    goto LAB_0010a452;
                  }
                  bVar2 = *(byte *)((long)ptr + 0x38) & 4;
                }
                if (bVar2 != 0) goto LAB_0010a5c9;
              }
LAB_0010a4a2:
              puVar13 = puStack_38;
              dVar12 = message.timeStamp;
              uVar6 = puVar5[3];
              uVar3 = *(undefined4 *)(puVar5 + 4);
              *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a4b2;
              lVar17 = snd_midi_event_decode(uVar6,puVar13,uVar3,dVar12);
              puVar13 = puStack_38;
              puVar11 = message.bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (0 < lVar17) {
                if (bVar10) {
                  puVar18 = puStack_38 + lVar17;
                  *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a4d8;
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  insert<unsigned_char*,void>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_70,
                             (const_iterator)puVar11,puVar13,puVar18);
                }
                else {
                  puVar18 = puStack_38 + lVar17;
                  *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a4ed;
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_assign_aux<unsigned_char*>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_70,puVar13
                             ,puVar18);
                }
                if ((*(char *)message.timeStamp != -0x7e) ||
                   (bVar10 = true,
                   message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[-1] == 0xf7)) {
                  message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  uVar20 = (ulong)*(uint *)(puVar5 + 8);
                  uVar21 = (ulong)*(uint *)((long)puVar5 + 0x44);
                  uVar4 = *(uint *)((long)message.timeStamp + 8);
                  if (uVar4 < *(uint *)((long)puVar5 + 0x44)) {
                    iVar16 = (int)((long)(uVar21 - (long)(int)uVar4) / 1000000000);
                    uVar21 = uVar21 - (long)(iVar16 * 1000000000 + 1000000000);
                    uVar20 = uVar20 + (long)iVar16 + 1;
                  }
                  if (1000000000 < (long)(uVar4 - uVar21)) {
                    lVar17 = (long)((long)(int)uVar4 - uVar21) / 1000000000;
                    uVar20 = uVar20 - lVar17;
                    uVar21 = uVar21 + (lVar17 * 0x3b9aca0000000000 >> 0x20);
                  }
                  iVar16 = *(int *)((long)message.timeStamp + 4);
                  puVar5[8] = *(undefined8 *)((long)message.timeStamp + 4);
                  if (*(char *)((long)ptr + 0x3a) == '\x01') {
                    *(undefined1 *)((long)ptr + 0x3a) = 0;
                  }
                  else {
                    message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)((double)(long)((long)(int)uVar4 - uVar21) * 1e-09 +
                                  (double)(long)((long)iVar16 - uVar20));
                  }
                  bVar10 = false;
                }
              }
            }
LAB_0010a5c9:
            dVar12 = message.timeStamp;
            *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a5d2;
            snd_seq_free_event(dVar12);
            puVar11 = message.bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (((undefined1  [8])
                 message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start != local_70) && (!bVar10)) {
              if (*(char *)((long)ptr + 0x48) == '\x01') {
                uVar6 = *(undefined8 *)((long)ptr + 0x58);
                pcVar7 = *(code **)((long)ptr + 0x50);
                *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a602;
                (*pcVar7)(puVar11,local_70,uVar6);
              }
              else {
                *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a613;
                bVar14 = MidiInApi::MidiQueue::push((MidiQueue *)ptr,(MidiMessage *)local_70);
                if (!bVar14) {
                  *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a62e;
                  std::operator<<((ostream *)&std::cerr,
                                  "\nMidiInAlsa: message queue limit reached!!\n\n");
                }
              }
            }
          }
        }
      }
      *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a661;
      free(puVar13);
      uVar6 = *(undefined8 *)local_78;
      *(undefined8 *)((long)&uStack_80 + lVar9) = 0x10a66d;
      snd_midi_event_free(uVar6);
      puVar5[3] = 0;
      puVar5[6] = puVar5[7];
    }
  }
  __fds[-1].fd = 0x10a6c3;
  __fds[-1].events = 0;
  __fds[-1].revents = 0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  return (void *)0x0;
}

Assistant:

static void *alsaMidiHandler( void *ptr )
{
  MidiInApi::RtMidiInData *data = static_cast<MidiInApi::RtMidiInData *> (ptr);
  AlsaMidiData *apiData = static_cast<AlsaMidiData *> (data->apiData);

  long nBytes;
  double time;
  bool continueSysex = false;
  bool doDecode = false;
  MidiInApi::MidiMessage message;
  int poll_fd_count;
  struct pollfd *poll_fds;

  snd_seq_event_t *ev;
  int result;
  apiData->bufferSize = 32;
  result = snd_midi_event_new( 0, &apiData->coder );
  if ( result < 0 ) {
    data->doInput = false;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing MIDI event parser!\n\n";
    return 0;
  }
  unsigned char *buffer = (unsigned char *) malloc( apiData->bufferSize );
  if ( buffer == NULL ) {
    data->doInput = false;
    snd_midi_event_free( apiData->coder );
    apiData->coder = 0;
    std::cerr << "\nMidiInAlsa::alsaMidiHandler: error initializing buffer memory!\n\n";
    return 0;
  }
  snd_midi_event_init( apiData->coder );
  snd_midi_event_no_status( apiData->coder, 1 ); // suppress running status messages

  poll_fd_count = snd_seq_poll_descriptors_count( apiData->seq, POLLIN ) + 1;
  poll_fds = (struct pollfd*)alloca( poll_fd_count * sizeof( struct pollfd ));
  snd_seq_poll_descriptors( apiData->seq, poll_fds + 1, poll_fd_count - 1, POLLIN );
  poll_fds[0].fd = apiData->trigger_fds[0];
  poll_fds[0].events = POLLIN;

  while ( data->doInput ) {

    if ( snd_seq_event_input_pending( apiData->seq, 1 ) == 0 ) {
      // No data pending
      if ( poll( poll_fds, poll_fd_count, -1) >= 0 ) {
        if ( poll_fds[0].revents & POLLIN ) {
          bool dummy;
          int res = read( poll_fds[0].fd, &dummy, sizeof(dummy) );
          (void) res;
        }
      }
      continue;
    }

    // If here, there should be data.
    result = snd_seq_event_input( apiData->seq, &ev );
    if ( result == -ENOSPC ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: MIDI input buffer overrun!\n\n";
      continue;
    }
    else if ( result <= 0 ) {
      std::cerr << "\nMidiInAlsa::alsaMidiHandler: unknown MIDI input error!\n";
      perror("System reports");
      continue;
    }

    // This is a bit weird, but we now have to decode an ALSA MIDI
    // event (back) into MIDI bytes.  We'll ignore non-MIDI types.
    if ( !continueSysex ) message.bytes.clear();

    doDecode = false;
    switch ( ev->type ) {

    case SND_SEQ_EVENT_PORT_SUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cout << "MidiInAlsa::alsaMidiHandler: port connection made!\n";
#endif
      break;

    case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
#if defined(__RTMIDI_DEBUG__)
      std::cerr << "MidiInAlsa::alsaMidiHandler: port connection has closed!\n";
      std::cout << "sender = " << (int) ev->data.connect.sender.client << ":"
                << (int) ev->data.connect.sender.port
                << ", dest = " << (int) ev->data.connect.dest.client << ":"
                << (int) ev->data.connect.dest.port
                << std::endl;
#endif
      break;

    case SND_SEQ_EVENT_QFRAME: // MIDI time code
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_TICK: // 0xF9 ... MIDI timing tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_CLOCK: // 0xF8 ... MIDI timing (clock) tick
      if ( !( data->ignoreFlags & 0x02 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SENSING: // Active sensing
      if ( !( data->ignoreFlags & 0x04 ) ) doDecode = true;
      break;

    case SND_SEQ_EVENT_SYSEX:
      if ( (data->ignoreFlags & 0x01) ) break;
      if ( ev->data.ext.len > apiData->bufferSize ) {
        apiData->bufferSize = ev->data.ext.len;
        free( buffer );
        buffer = (unsigned char *) malloc( apiData->bufferSize );
        if ( buffer == NULL ) {
          data->doInput = false;
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: error resizing buffer memory!\n\n";
          break;
        }
      }
      doDecode = true;
      break;

    default:
      doDecode = true;
    }

    if ( doDecode ) {

      nBytes = snd_midi_event_decode( apiData->coder, buffer, apiData->bufferSize, ev );
      if ( nBytes > 0 ) {
        // The ALSA sequencer has a maximum buffer size for MIDI sysex
        // events of 256 bytes.  If a device sends sysex messages larger
        // than this, they are segmented into 256 byte chunks.  So,
        // we'll watch for this and concatenate sysex chunks into a
        // single sysex message if necessary.
        if ( !continueSysex )
          message.bytes.assign( buffer, &buffer[nBytes] );
        else
          message.bytes.insert( message.bytes.end(), buffer, &buffer[nBytes] );

        continueSysex = ( ( ev->type == SND_SEQ_EVENT_SYSEX ) && ( message.bytes.back() != 0xF7 ) );
        if ( !continueSysex ) {

          // Calculate the time stamp:
          message.timeStamp = 0.0;

          // Method 1: Use the system time.
          //(void)gettimeofday(&tv, (struct timezone *)NULL);
          //time = (tv.tv_sec * 1000000) + tv.tv_usec;

          // Method 2: Use the ALSA sequencer event time data.
          // (thanks to Pedro Lopez-Cabanillas!).

          // Using method from:
          // https://www.gnu.org/software/libc/manual/html_node/Elapsed-Time.html

          // Perform the carry for the later subtraction by updating y.
          // Temp var y is timespec because computation requires signed types,
          // while snd_seq_real_time_t has unsigned types.
          snd_seq_real_time_t &x( ev->time.time );
          struct timespec y;
          y.tv_nsec = apiData->lastTime.tv_nsec;
          y.tv_sec = apiData->lastTime.tv_sec;
          if ( x.tv_nsec < y.tv_nsec ) {
              int nsec = (y.tv_nsec - (int)x.tv_nsec) / 1000000000 + 1;
              y.tv_nsec -= 1000000000 * nsec;
              y.tv_sec += nsec;
          }
          if ( x.tv_nsec - y.tv_nsec > 1000000000 ) {
              int nsec = ((int)x.tv_nsec - y.tv_nsec) / 1000000000;
              y.tv_nsec += 1000000000 * nsec;
              y.tv_sec -= nsec;
          }

          // Compute the time difference.
          time = (int)x.tv_sec - y.tv_sec + ((int)x.tv_nsec - y.tv_nsec)*1e-9;

          apiData->lastTime = ev->time.time;

          if ( data->firstMessage == true )
            data->firstMessage = false;
          else
            message.timeStamp = time;
        }
        else {
#if defined(__RTMIDI_DEBUG__)
          std::cerr << "\nMidiInAlsa::alsaMidiHandler: event parsing error or not a MIDI event!\n\n";
#endif
        }
      }
    }

    snd_seq_free_event( ev );
    if ( message.bytes.size() == 0 || continueSysex ) continue;

    if ( data->usingCallback ) {
      RtMidiIn::RtMidiCallback callback = (RtMidiIn::RtMidiCallback) data->userCallback;
      callback( message.timeStamp, &message.bytes, data->userData );
    }
    else {
      // As long as we haven't reached our queue size limit, push the message.
      if ( !data->queue.push( message ) )
        std::cerr << "\nMidiInAlsa: message queue limit reached!!\n\n";
    }
  }

  if ( buffer ) free( buffer );
  snd_midi_event_free( apiData->coder );
  apiData->coder = 0;
  apiData->thread = apiData->dummy_thread_id;
  return 0;
}